

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

void amrex::MultiFab::LinComb
               (MultiFab *dst,Real a,MultiFab *x,int xcomp,Real b,MultiFab *y,int ycomp,int dstcomp,
               int numcomp,IntVect *nghost)

{
  int iVar1;
  bool bVar2;
  int in_EDX;
  MFIter *in_RDI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  int in_stack_00000008;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dfab;
  Array4<const_double> yfab;
  Array4<const_double> xfab;
  Box *bx;
  MFIter mfi;
  int in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  int iVar3;
  int local_2c0;
  int local_2bc;
  undefined1 in_stack_fffffffffffffd57;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  IntVect *in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  int local_258;
  int local_254;
  int local_250;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  int local_218;
  int local_214;
  int local_210;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  Box local_1b4;
  Box *local_198;
  MFIter local_190;
  int local_130;
  int local_12c;
  double local_120;
  int local_114;
  double local_108;
  IntVect *local_f8;
  int local_f0;
  Box *local_e8;
  int local_dc;
  int iStack_d8;
  int local_d4;
  undefined8 local_d0;
  int local_c8;
  Box *local_c0;
  int local_b4;
  int iStack_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  Box *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  Box *local_8;
  
  local_130 = in_R9D;
  local_12c = in_R8D;
  local_120 = in_XMM1_Qa;
  local_114 = in_EDX;
  local_108 = in_XMM0_Qa;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 (bool)in_stack_fffffffffffffd57);
  while (bVar2 = MFIter::isValid(&local_190), bVar2) {
    MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    local_198 = &local_1b4;
    bVar2 = Box::ok(local_198);
    if (bVar2) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),in_RDI);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),in_RDI);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),in_RDI);
      local_e8 = local_198;
      local_8 = local_198;
      local_c = 0;
      local_dc = (local_198->smallend).vect[0];
      local_18 = local_198;
      local_1c = 1;
      iStack_d8 = (local_198->smallend).vect[1];
      in_stack_fffffffffffffd68 = *(IntVect **)(local_198->smallend).vect;
      local_28 = local_198;
      local_2c = 2;
      in_stack_fffffffffffffd70 = (local_198->smallend).vect[2];
      local_c0 = local_198;
      local_38 = &local_198->bigend;
      local_3c = 0;
      local_b4 = local_38->vect[0];
      local_48 = &local_198->bigend;
      local_4c = 1;
      iStack_b0 = (local_198->bigend).vect[1];
      local_d0 = *(undefined8 *)local_38->vect;
      local_58 = &local_198->bigend;
      local_5c = 2;
      local_c8 = (local_198->bigend).vect[2];
      for (local_2bc = 0; local_2c0 = in_stack_fffffffffffffd70,
          local_f8 = in_stack_fffffffffffffd68, local_f0 = in_stack_fffffffffffffd70,
          local_d4 = in_stack_fffffffffffffd70, local_ac = local_c8, local_2bc < in_stack_00000008;
          local_2bc = local_2bc + 1) {
        for (; iVar3 = iStack_d8, local_2c0 <= local_c8; local_2c0 = local_2c0 + 1) {
          for (; iVar1 = local_dc, iVar3 <= iStack_b0; iVar3 = iVar3 + 1) {
            while (in_stack_fffffffffffffd38 = iVar1, in_stack_fffffffffffffd38 <= local_b4) {
              local_8c = local_2c0;
              local_90 = local_114 + local_2bc;
              local_80 = &local_1f8;
              local_a4 = local_2c0;
              local_a8 = local_12c + local_2bc;
              local_98 = &local_238;
              local_74 = local_2c0;
              local_78 = local_130 + local_2bc;
              local_68 = &local_278;
              *(double *)
               (local_278 +
               ((long)(in_stack_fffffffffffffd38 - local_258) + (iVar3 - local_254) * local_270 +
                (local_2c0 - local_250) * local_268 + local_78 * local_260) * 8) =
                   local_108 *
                   *(double *)
                    (local_1f8 +
                    ((long)(in_stack_fffffffffffffd38 - local_1d8) + (iVar3 - local_1d4) * local_1f0
                     + (local_2c0 - local_1d0) * local_1e8 + local_90 * local_1e0) * 8) +
                   local_120 *
                   *(double *)
                    (local_238 +
                    ((long)(in_stack_fffffffffffffd38 - local_218) + (iVar3 - local_214) * local_230
                     + (local_2c0 - local_210) * local_228 + local_a8 * local_220) * 8);
              local_a0 = iVar3;
              local_9c = in_stack_fffffffffffffd38;
              local_88 = iVar3;
              local_84 = in_stack_fffffffffffffd38;
              local_70 = iVar3;
              local_6c = in_stack_fffffffffffffd38;
              iVar1 = in_stack_fffffffffffffd38 + 1;
            }
          }
          in_stack_fffffffffffffd3c = iVar3;
        }
      }
    }
    MFIter::operator++(&local_190);
  }
  MFIter::~MFIter(in_RDI);
  return;
}

Assistant:

void
MultiFab::LinComb (MultiFab& dst,
                   Real a, const MultiFab& x, int xcomp,
                   Real b, const MultiFab& y, int ycomp,
                   int dstcomp, int numcomp, const IntVect& nghost)
{
    BL_ASSERT(dst.boxArray() == x.boxArray());
    BL_ASSERT(dst.distributionMap == x.distributionMap);
    BL_ASSERT(dst.boxArray() == y.boxArray());
    BL_ASSERT(dst.distributionMap == y.distributionMap);
    BL_ASSERT(dst.nGrowVect().allGE(nghost) && x.nGrowVect().allGE(nghost) && y.nGrowVect().allGE(nghost));

    BL_PROFILE("MultiFab::LinComb()");

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& xma = x.const_arrays();
        auto const& yma = y.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstma[box_no](i,j,k,dstcomp+n) = a*xma[box_no](i,j,k,xcomp+n)
                +                            b*yma[box_no](i,j,k,ycomp+n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);

            if (bx.ok()) {
                auto const xfab =   x.array(mfi);
                auto const yfab =   y.array(mfi);
                auto       dfab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dfab(i,j,k,dstcomp+n) = a*xfab(i,j,k,xcomp+n) + b*yfab(i,j,k,ycomp+n);
                });
            }
        }
    }
}